

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
slang::CommandLine::parseStr
          (CommandLine *this,string_view argList,ParseOptions options,bool *hasArg,string *current,
          SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *storage)

{
  char cVar1;
  string *psVar2;
  bool bVar3;
  const_pointer pvVar4;
  size_type sVar5;
  char **ptr_00;
  char *end_00;
  char **ppcVar6;
  string_view argList_00;
  byte local_ea;
  byte local_e9;
  string local_d8;
  ParseOptions local_a4;
  string_view local_a0;
  ParseOptions local_8c;
  undefined1 local_88 [4];
  ParseOptions newOptions;
  string result;
  char c;
  const_pointer end;
  const_pointer ptr;
  anon_class_24_3_9a0900af pushArg;
  string *current_local;
  bool *hasArg_local;
  CommandLine *this_local;
  undefined1 auStack_18 [4];
  ParseOptions options_local;
  string_view argList_local;
  
  _auStack_18 = (pointer)argList._M_len;
  pushArg.hasArg = (bool *)storage;
  ptr = hasArg;
  pushArg.storage =
       (SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)current;
  pushArg.current = current;
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
  end = pvVar4;
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
  ptr_00 = (char **)(pvVar4 + sVar5);
  ppcVar6 = (char **)end;
LAB_0028debb:
  while( true ) {
    end = (const_pointer)ppcVar6;
    if ((char **)end == ptr_00) {
      return;
    }
    end_00 = end + 1;
    cVar1 = *end;
    end = end_00;
    bVar3 = isWhitespace(cVar1);
    if (!bVar3) break;
    parseStr::anon_class_24_3_9a0900af::operator()((anon_class_24_3_9a0900af *)&ptr);
    ppcVar6 = (char **)end;
  }
  if ((((uint)options & 1) != 0) && ((cVar1 == '#' || (cVar1 == '/')))) {
    if (cVar1 == '#') {
      parseStr::anon_class_24_3_9a0900af::operator()((anon_class_24_3_9a0900af *)&ptr);
      while( true ) {
        local_e9 = 0;
        if ((char **)end != ptr_00) {
          bVar3 = isNewline(*end);
          local_e9 = bVar3 ^ 0xff;
        }
        ppcVar6 = (char **)end;
        if ((local_e9 & 1) == 0) break;
        end = end + 1;
      }
      goto LAB_0028debb;
    }
    if (((*hasArg & 1U) == 0) && ((char **)end != ptr_00)) {
      if (*end == '/') {
        parseStr::anon_class_24_3_9a0900af::operator()((anon_class_24_3_9a0900af *)&ptr);
        do {
          end = end + 1;
          local_ea = 0;
          if ((char **)end != ptr_00) {
            bVar3 = isNewline(*end);
            local_ea = bVar3 ^ 0xff;
          }
          ppcVar6 = (char **)end;
        } while ((local_ea & 1) != 0);
      }
      else {
        if (*end != '*') goto LAB_0028e068;
        parseStr::anon_class_24_3_9a0900af::operator()((anon_class_24_3_9a0900af *)&ptr);
        ppcVar6 = (char **)(end + 1);
        do {
          end = (const_pointer)ppcVar6;
          ppcVar6 = (char **)end;
          if ((char **)end == ptr_00) goto LAB_0028debb;
          ppcVar6 = (char **)(end + 1);
        } while (((*end != '*') || (ppcVar6 == ptr_00)) || (*(char *)ppcVar6 != '/'));
        ppcVar6 = (char **)(end + 2);
      }
      goto LAB_0028debb;
    }
  }
LAB_0028e068:
  if (((cVar1 == '$') && (((uint)options & 0x10000) != 0)) && ((char **)end != ptr_00)) {
    expandVar_abi_cxx11_((string *)local_88,(CommandLine *)&end,ptr_00,end_00);
    local_8c.ignoreDuplicates = options.ignoreDuplicates;
    local_8c._0_2_ = options._0_2_;
    local_8c.expandEnvVars = false;
    argList_00 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
    local_a4 = local_8c;
    local_a0 = argList_00;
    parseStr(this,argList_00,local_8c,hasArg,pushArg.current,storage);
    std::__cxx11::string::~string((string *)local_88);
    ppcVar6 = (char **)end;
  }
  else {
    *hasArg = true;
    if (cVar1 == '\\') {
      ppcVar6 = (char **)end;
      if ((char **)end != ptr_00) {
        cVar1 = *end;
        end = end + 1;
        std::__cxx11::string::operator+=((string *)pushArg.current,cVar1);
        ppcVar6 = (char **)end;
      }
    }
    else if (cVar1 == '\'') {
      while (ppcVar6 = (char **)end, (char **)end != ptr_00) {
        cVar1 = *end;
        ppcVar6 = (char **)(end + 1);
        if (cVar1 == '\'') break;
        end = end + 1;
        std::__cxx11::string::operator+=((string *)pushArg.current,cVar1);
      }
    }
    else if (cVar1 == '\"') {
      while (psVar2 = pushArg.current, ppcVar6 = (char **)end, (char **)end != ptr_00) {
        ppcVar6 = (char **)(end + 1);
        result.field_2._M_local_buf[0xf] = *end;
        if (result.field_2._M_local_buf[0xf] == '\"') break;
        if (((result.field_2._M_local_buf[0xf] == '\\') && (ppcVar6 != ptr_00)) &&
           ((*(char *)ppcVar6 == '\\' || (*(char *)ppcVar6 == '\"')))) {
          result.field_2._M_local_buf[0xf] = *(undefined1 *)ppcVar6;
          ppcVar6 = (char **)(end + 2);
        }
        end = (const_pointer)ppcVar6;
        if (((result.field_2._M_local_buf[0xf] == '$') && (((uint)options & 0x10000) != 0)) &&
           ((char **)end != ptr_00)) {
          expandVar_abi_cxx11_(&local_d8,(CommandLine *)&end,ptr_00,end);
          std::__cxx11::string::append((string *)psVar2);
          std::__cxx11::string::~string((string *)&local_d8);
        }
        else {
          std::__cxx11::string::operator+=
                    ((string *)pushArg.current,result.field_2._M_local_buf[0xf]);
        }
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)pushArg.current,cVar1);
      ppcVar6 = (char **)end;
    }
  }
  goto LAB_0028debb;
}

Assistant:

void CommandLine::parseStr(string_view argList, ParseOptions options, bool& hasArg,
                           std::string& current, SmallVectorBase<std::string>& storage) {
    auto pushArg = [&]() {
        if (hasArg) {
            storage.emplace_back(std::move(current));
            current.clear();
            hasArg = false;
        }
    };

    auto ptr = argList.data();
    auto end = ptr + argList.size();
    while (ptr != end) {
        // Whitespace breaks up arguments.
        char c = *ptr++;
        if (isWhitespace(c)) {
            pushArg();
            continue;
        }

        // Check for and consume comments.
        if (options.supportComments && (c == '#' || c == '/')) {
            // Slash character only applies if we aren't building an argument already.
            // The hash always applies, even if adjacent to an argument.
            if (c == '#') {
                pushArg();
                while (ptr != end && !isNewline(*ptr))
                    ptr++;
                continue;
            }

            if (!hasArg && ptr != end) {
                if (*ptr == '/') {
                    pushArg();
                    ptr++;
                    while (ptr != end && !isNewline(*ptr))
                        ptr++;
                    continue;
                }
                else if (*ptr == '*') {
                    pushArg();
                    ptr++;
                    while (ptr != end) {
                        c = *ptr++;
                        if (c == '*' && ptr != end && *ptr == '/') {
                            ptr++;
                            break;
                        }
                    }
                    continue;
                }
            }
        }

        // Look for environment variables to expand.
        if (c == '$' && options.expandEnvVars && ptr != end) {
            std::string result = expandVar(ptr, end);

            ParseOptions newOptions = options;
            newOptions.expandEnvVars = false;
            parseStr(result, newOptions, hasArg, current, storage);
            continue;
        }

        // Any non-whitespace character here means we are building an argument.
        hasArg = true;

        // Escape character preserves the value of the next character.
        if (c == '\\') {
            if (ptr != end)
                current += *ptr++;
            continue;
        }

        // Single quotes consume all characters until the next single quote.
        if (c == '\'') {
            while (ptr != end) {
                c = *ptr++;
                if (c == '\'')
                    break;
                current += c;
            }
            continue;
        }

        // Double quotes consume all characters except escaped characters.
        if (c == '"') {
            while (ptr != end) {
                c = *ptr++;
                if (c == '"')
                    break;

                // Only backslashes and quotes can be escaped.
                if (c == '\\' && ptr != end && (*ptr == '\\' || *ptr == '"'))
                    c = *ptr++;

                if (c == '$' && options.expandEnvVars && ptr != end)
                    current.append(expandVar(ptr, end));
                else
                    current += c;
            }
            continue;
        }

        // Otherwise we just have a normal character.
        current += c;
    }
}